

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void __thiscall ExpressionContext::PushScope(ExpressionContext *this,ScopeType type)

{
  uint uniqueId;
  int iVar1;
  undefined4 extraout_var;
  ScopeData *next;
  ScopeData *local_20;
  ScopeData *this_00;
  
  iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,400);
  this_00 = (ScopeData *)CONCAT44(extraout_var,iVar1);
  uniqueId = this->uniqueScopeId;
  this->uniqueScopeId = uniqueId + 1;
  ScopeData::ScopeData(this_00,this->allocator,this->scope,uniqueId,type);
  local_20 = this_00;
  if (this->scope != (ScopeData *)0x0) {
    SmallArray<ScopeData_*,_2U>::push_back(&this->scope->scopes,&local_20);
    local_20->startOffset = this->scope->dataSize;
  }
  this->scope = local_20;
  if (this->lookupLocation != (SynBase *)0x0) {
    local_20->unrestricted = true;
  }
  return;
}

Assistant:

void ExpressionContext::PushScope(ScopeType type)
{
	ScopeData *next = new (get<ScopeData>()) ScopeData(allocator, scope, uniqueScopeId++, type);

	if(scope)
	{
		scope->scopes.push_back(next);

		next->startOffset = scope->dataSize;
	}

	scope = next;

	if(lookupLocation)
		scope->unrestricted = true;
}